

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BackwardPass.cpp
# Opt level: O1

bool __thiscall BackwardPass::ReverseCopyProp(BackwardPass *this,Instr *instr)

{
  OpCode OVar1;
  undefined2 valueType;
  StackSym *pSVar2;
  code *pcVar3;
  bool bVar4;
  OpndKind OVar5;
  BOOLEAN BVar6;
  uint sourceContextId;
  uint functionId;
  BOOL BVar7;
  uint32 uVar8;
  BVIndex BVar9;
  BailOutKind BVar10;
  JITTimeFunctionBody *this_00;
  FunctionJITTimeInfo *this_01;
  RegOpnd *opnd;
  RegOpnd *opnd_00;
  Instr *this_02;
  StackSym *this_03;
  BailOutInfo *pBVar11;
  RegOpnd *pRVar12;
  ByteCodeUsesInstr *this_04;
  BVSparse<Memory::JitArenaAllocator> *pBVar13;
  StackSym *pSVar14;
  Type *pTVar15;
  int iVar16;
  Type_conflict pBVar17;
  undefined1 local_68 [8];
  Iterator __iter;
  
  this_00 = JITTimeWorkItem::GetJITFunctionBody(this->func->m_workItem);
  sourceContextId = JITTimeFunctionBody::GetSourceContextId(this_00);
  this_01 = JITTimeWorkItem::GetJITTimeInfo(this->func->m_workItem);
  functionId = FunctionJITTimeInfo::GetLocalFunctionId(this_01);
  bVar4 = Js::Phases::IsEnabled
                    ((Phases *)&DAT_015bbe90,ReverseCopyPropPhase,sourceContextId,functionId);
  if (bVar4) {
    return false;
  }
  if (this->tag != DeadStorePhase) {
    return false;
  }
  if (this->currentPrePassLoop != (Loop *)0x0) {
    return false;
  }
  if (this->isCollectionPass != false) {
    return false;
  }
  BVar7 = Func::HasTry(this->func);
  if (BVar7 != 0) {
    return false;
  }
  if ((instr->m_opcode != Ld_I4) && (instr->m_opcode != Ld_A)) {
    return false;
  }
  OVar5 = IR::Opnd::GetKind(instr->m_dst);
  if (OVar5 != OpndKindReg) {
    return false;
  }
  OVar5 = IR::Opnd::GetKind(instr->m_src1);
  if (OVar5 != OpndKindReg) {
    return false;
  }
  if ((instr->field_0x38 & 0x10) != 0) {
    return false;
  }
  opnd = IR::Opnd::AsRegOpnd(instr->m_dst);
  opnd_00 = IR::Opnd::AsRegOpnd(instr->m_src1);
  this_02 = IR::Instr::GetPrevRealInstrOrLabel(instr);
  this_03 = opnd_00->m_sym;
  if ((this_03->field_0x1a & 1) != 0) {
    this_03 = StackSym::GetVarEquivSym(this_03,this->func);
  }
  if (this_02->m_dst != (Opnd *)0x0) {
    this_04 = (ByteCodeUsesInstr *)0x0;
    goto LAB_003e3032;
  }
  if (this_02->m_opcode != ByteCodeUses) {
    return false;
  }
  this_04 = IR::Instr::AsByteCodeUsesInstr(this_02);
  pBVar13 = IR::ByteCodeUsesInstr::GetByteCodeUpwardExposedUsed(this_04);
  if ((pBVar13 == (BVSparse<Memory::JitArenaAllocator> *)0x0) ||
     (BVar6 = BVSparse<Memory::JitArenaAllocator>::Test(pBVar13,(this_03->super_Sym).m_id),
     BVar6 == '\0')) {
LAB_003e323b:
    bVar4 = false;
  }
  else {
    pBVar17 = pBVar13->head;
    iVar16 = 0;
    if (pBVar17 == (Type_conflict)0x0) goto LAB_003e323b;
    do {
      BVar9 = BVUnitT<unsigned_long>::CountBit((pBVar17->data).word);
      iVar16 = iVar16 + BVar9;
      pBVar17 = pBVar17->next;
    } while (pBVar17 != (Type)0x0);
    if (iVar16 != 1) goto LAB_003e323b;
    this_02 = IR::Instr::GetPrevRealInstrOrLabel(&this_04->super_Instr);
    bVar4 = this_02->m_dst != (Opnd *)0x0;
  }
  if (!bVar4) {
    return false;
  }
LAB_003e3032:
  OVar1 = this_02->m_opcode;
  if (OVar1 == LdElemI_A) {
    return false;
  }
  if (OVar1 == IsInst) {
    return false;
  }
  if (OVar1 == ByteCodeUses) {
    return false;
  }
  if ((this_02->field_0x38 & 0x10) != 0) {
    uVar8 = IR::Instr::GetByteCodeOffset(this_02);
    pBVar11 = IR::Instr::GetBailOutInfo(this_02);
    if (uVar8 != pBVar11->bailOutOffset) {
      return false;
    }
  }
  bVar4 = IR::Opnd::IsEqual(this_02->m_dst,&opnd_00->super_Opnd);
  if ((((bVar4) &&
       (BVar6 = BVSparse<Memory::JitArenaAllocator>::Test
                          (this->currentBlock->upwardExposedUses,(opnd_00->m_sym->super_Sym).m_id),
       BVar6 == '\0')) &&
      ((pBVar13 = this->currentBlock->byteCodeUpwardExposedUsed,
       pBVar13 == (BVSparse<Memory::JitArenaAllocator> *)0x0 ||
       (BVar6 = BVSparse<Memory::JitArenaAllocator>::Test(pBVar13,(this_03->super_Sym).m_id),
       BVar6 == '\0')))) && (bVar4 = DoDeadStore(this->func,opnd_00->m_sym), bVar4)) {
    if ((((this_02->field_0x38 & 0x10) != 0) && (pSVar2 = opnd->m_sym, pSVar2->m_type == TyInt32))
       && ((pSVar2->field_0x1a & 1) != 0)) {
      pSVar14 = IR::RegOpnd::TryGetStackSym(this_02->m_dst);
      BVar10 = IR::Instr::GetBailOutKind(this_02);
      if (((pSVar14 != (StackSym *)0x0) && ((BVar10 & BailOutOnResultConditions) != BailOutInvalid))
         && ((((pSVar14->m_type == TyInt32 &&
               (((pSVar14->field_0x1a & 1) != 0 && (this_02->m_src1 != (Opnd *)0x0)))) &&
              (bVar4 = IR::Opnd::IsEqual(this_02->m_dst,this_02->m_src1), !bVar4)) &&
             ((this_02->m_src2 == (Opnd *)0x0 ||
              (bVar4 = IR::Opnd::IsEqual(this_02->m_dst,this_02->m_src2), !bVar4)))))) {
        pBVar11 = IR::Instr::GetBailOutInfo(this_02);
        local_68 = (undefined1  [8])&pBVar11->usedCapturedValues->copyPropSyms;
        __iter.list = (SListBase<JsUtil::KeyValuePair<StackSym_*,_StackSym_*>,_Memory::ArenaAllocator,_RealCount>
                       *)local_68;
        __iter.current = (NodeBase *)__tls_get_addr(&PTR_0155fe48);
        while( true ) {
          if (__iter.list ==
              (SListBase<JsUtil::KeyValuePair<StackSym_*,_StackSym_*>,_Memory::ArenaAllocator,_RealCount>
               *)0x0) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *(undefined4 *)&(__iter.current)->next = 1;
            bVar4 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                               ,0x76,"(current != nullptr)","current != nullptr");
            if (!bVar4) {
              pcVar3 = (code *)invalidInstructionException();
              (*pcVar3)();
            }
            *(undefined4 *)&(__iter.current)->next = 0;
          }
          __iter.list = (SListBase<JsUtil::KeyValuePair<StackSym_*,_StackSym_*>,_Memory::ArenaAllocator,_RealCount>
                         *)((__iter.list)->super_SListNodeBase<Memory::ArenaAllocator>).next;
          if ((undefined1  [8])__iter.list == local_68) break;
          pTVar15 = SListBase<JsUtil::KeyValuePair<StackSym_*,_StackSym_*>,_Memory::ArenaAllocator,_RealCount>
                    ::Iterator::Data((Iterator *)local_68);
          if (pSVar2 == pTVar15->value) {
            return false;
          }
        }
        __iter.list = (SListBase<JsUtil::KeyValuePair<StackSym_*,_StackSym_*>,_Memory::ArenaAllocator,_RealCount>
                       *)0x0;
      }
    }
    if (this_04 == (ByteCodeUsesInstr *)0x0) {
      pRVar12 = IR::Opnd::AsRegOpnd(this_02->m_dst);
      if (((((pRVar12->super_Opnd).field_0xb & 8) != 0) &&
          (((opnd_00->super_Opnd).field_0xb & 8) == 0)) && ((this_03->field_0x19 & 0x20) != 0)) {
        BVSparse<Memory::JitArenaAllocator>::Set
                  (this->currentBlock->byteCodeUpwardExposedUsed,(this_03->super_Sym).m_id);
      }
    }
    else {
      if (((this->currentBlock->byteCodeUpwardExposedUsed !=
            (BVSparse<Memory::JitArenaAllocator> *)0x0) &&
          (pRVar12 = IR::Opnd::AsRegOpnd(this_02->m_dst), ((pRVar12->super_Opnd).field_0xb & 8) != 0
          )) && ((this_03->field_0x19 & 0x20) != 0)) {
        BVSparse<Memory::JitArenaAllocator>::Set
                  (this->currentBlock->byteCodeUpwardExposedUsed,(this_03->super_Sym).m_id);
        bVar4 = IR::Opnd::IsEqual(&opnd_00->super_Opnd,&opnd->super_Opnd);
        if ((bVar4) && ((this_02->m_dst->field_0xb & 8) != 0)) {
          IR::Opnd::SetIsJITOptimizedReg(&opnd->super_Opnd,true);
        }
      }
      IR::Instr::Remove(&this_04->super_Instr);
    }
    if ((this->tag == DeadStorePhase) && (bVar4 = SatisfyMarkTempObjectsConditions(this), bVar4)) {
      ObjectTempVerify::NotifyReverseCopyProp
                (&this->currentBlock->tempObjectVerifyTracker->super_ObjectTempVerify,this_02);
    }
    valueType = this_02->m_dst->m_valueType;
    IR::Opnd::SetValueType(&opnd->super_Opnd,(ValueType)valueType);
    IR::Instr::ReplaceDst(this_02,&opnd->super_Opnd);
    IR::Instr::Remove(instr);
    return true;
  }
  return false;
}

Assistant:

bool
BackwardPass::ReverseCopyProp(IR::Instr *instr)
{
    // Look for :
    //
    //  t1 = instr
    //       [bytecodeuse t1]
    //  t2 = Ld_A t1            >> t1 !upwardExposed
    //
    // Transform into:
    //
    //  t2 = instr
    //
    if (PHASE_OFF(Js::ReverseCopyPropPhase, this->func))
    {
        return false;
    }
    if (this->tag != Js::DeadStorePhase || this->IsPrePass() || this->IsCollectionPass())
    {
        return false;
    }
    if (this->func->HasTry())
    {
        // UpwardExposedUsed info can't be relied on
        return false;
    }

    // Find t2 = Ld_A t1
    switch (instr->m_opcode)
    {
    case Js::OpCode::Ld_A:
    case Js::OpCode::Ld_I4:
        break;

    default:
        return false;
    }

    if (!instr->GetDst()->IsRegOpnd())
    {
        return false;
    }
    if (!instr->GetSrc1()->IsRegOpnd())
    {
        return false;
    }
    if (instr->HasBailOutInfo())
    {
        return false;
    }

    IR::RegOpnd *dst = instr->GetDst()->AsRegOpnd();
    IR::RegOpnd *src = instr->GetSrc1()->AsRegOpnd();
    IR::Instr *instrPrev = instr->GetPrevRealInstrOrLabel();

    IR::ByteCodeUsesInstr *byteCodeUseInstr = nullptr;
    StackSym *varSym = src->m_sym;

    if (varSym->IsTypeSpec())
    {
        varSym = varSym->GetVarEquivSym(this->func);
    }

    // SKip ByteCodeUse instr if possible
    //       [bytecodeuse t1]
    if (!instrPrev->GetDst())
    {
        if (instrPrev->m_opcode == Js::OpCode::ByteCodeUses)
        {
            byteCodeUseInstr = instrPrev->AsByteCodeUsesInstr();
            const BVSparse<JitArenaAllocator>* byteCodeUpwardExposedUsed = byteCodeUseInstr->GetByteCodeUpwardExposedUsed();
            if (byteCodeUpwardExposedUsed && byteCodeUpwardExposedUsed->Test(varSym->m_id) && byteCodeUpwardExposedUsed->Count() == 1)
            {
                instrPrev = byteCodeUseInstr->GetPrevRealInstrOrLabel();

                if (!instrPrev->GetDst())
                {
                    return false;
                }
            }
            else
            {
                return false;
            }
        }
        else
        {
            return false;
        }
    }

    // The fast-path for these doesn't handle dst == src.
    // REVIEW: I believe the fast-path for LdElemI_A has been fixed... Nope, still broken for "i = A[i]" for prejit
    switch (instrPrev->m_opcode)
    {
    case Js::OpCode::LdElemI_A:
    case Js::OpCode::IsInst:
    case Js::OpCode::ByteCodeUses:
        return false;
    }

    // Can't do it if post-op bailout would need result
    // REVIEW: enable for pre-opt bailout?
    if (instrPrev->HasBailOutInfo() && instrPrev->GetByteCodeOffset() != instrPrev->GetBailOutInfo()->bailOutOffset)
    {
        return false;
    }

    // Make sure src of Ld_A == dst of instr
    //  t1 = instr
    if (!instrPrev->GetDst()->IsEqual(src))
    {
        return false;
    }

    // Make sure t1 isn't used later
    if (this->currentBlock->upwardExposedUses->Test(src->m_sym->m_id))
    {
        return false;
    }

    if (this->currentBlock->byteCodeUpwardExposedUsed && this->currentBlock->byteCodeUpwardExposedUsed->Test(varSym->m_id))
    {
        return false;
    }

    // Make sure we can dead-store this sym (debugger mode?)
    if (!this->DoDeadStore(this->func, src->m_sym))
    {
        return false;
    }

    StackSym *const dstSym = dst->m_sym;
    if(instrPrev->HasBailOutInfo() && dstSym->IsInt32() && dstSym->IsTypeSpec())
    {
        StackSym *const prevDstSym = IR::RegOpnd::TryGetStackSym(instrPrev->GetDst());
        if(instrPrev->GetBailOutKind() & IR::BailOutOnResultConditions &&
            prevDstSym &&
            prevDstSym->IsInt32() &&
            prevDstSym->IsTypeSpec() &&
            instrPrev->GetSrc1() &&
            !instrPrev->GetDst()->IsEqual(instrPrev->GetSrc1()) &&
            !(instrPrev->GetSrc2() && instrPrev->GetDst()->IsEqual(instrPrev->GetSrc2())))
        {
            // The previous instruction's dst value may be trashed by the time of the pre-op bailout. Skip reverse copy-prop if
            // it would replace the previous instruction's dst with a sym that bailout had decided to use to restore a value for
            // the pre-op bailout, which can't be trashed before bailout. See big comment in ProcessBailOutCopyProps for the
            // reasoning behind the tests above.
            FOREACH_SLISTBASE_ENTRY(
                CopyPropSyms,
                usedCopyPropSym,
                &instrPrev->GetBailOutInfo()->usedCapturedValues->copyPropSyms)
            {
                if(dstSym == usedCopyPropSym.Value())
                {
                    return false;
                }
            } NEXT_SLISTBASE_ENTRY;
        }
    }

    if (byteCodeUseInstr)
    {
        if (this->currentBlock->byteCodeUpwardExposedUsed && instrPrev->GetDst()->AsRegOpnd()->GetIsJITOptimizedReg() && varSym->HasByteCodeRegSlot())
        {
            if(varSym->HasByteCodeRegSlot())
            {
                this->currentBlock->byteCodeUpwardExposedUsed->Set(varSym->m_id);
            }

            if (src->IsEqual(dst) && instrPrev->GetDst()->GetIsJITOptimizedReg())
            {
                //      s2(s1).i32     =  FromVar        s1.var      #0000  Bailout: #0000 (BailOutIntOnly)
                //                        ByteCodeUses   s1
                //      s2(s1).i32     =  Ld_A           s2(s1).i32
                //
                // Since the dst on the FromVar is marked JITOptimized, we need to set it on the new dst as well,
                // or we'll change the bytecode liveness of s1

                dst->SetIsJITOptimizedReg(true);
            }
        }
        byteCodeUseInstr->Remove();
    }
    else if (instrPrev->GetDst()->AsRegOpnd()->GetIsJITOptimizedReg() && !src->GetIsJITOptimizedReg() && varSym->HasByteCodeRegSlot())
    {
        this->currentBlock->byteCodeUpwardExposedUsed->Set(varSym->m_id);
    }

#if DBG
    if (this->DoMarkTempObjectVerify())
    {
        this->currentBlock->tempObjectVerifyTracker->NotifyReverseCopyProp(instrPrev);
    }
#endif

    dst->SetValueType(instrPrev->GetDst()->GetValueType());
    instrPrev->ReplaceDst(dst);

    instr->Remove();

    return true;
}